

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLParser.cpp
# Opt level: O1

bool __thiscall llvm::yaml::Scanner::scanDirective(Scanner *this)

{
  iterator pcVar1;
  int *piVar2;
  ilist_node_base<false> *piVar3;
  int *piVar4;
  int *piVar5;
  int *piVar6;
  int *Position;
  ilist_node_base<false> *piVar7;
  undefined4 uVar8;
  bool bVar9;
  Token T;
  undefined4 uStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  undefined1 local_40 [16];
  
  unrollIndent(this,-1);
  (this->SimpleKeys).super_SmallVectorImpl<(anonymous_namespace)::SimpleKey>.
  super_SmallVectorTemplateBase<(anonymous_namespace)::SimpleKey,_true>.
  super_SmallVectorTemplateCommon<(anonymous_namespace)::SimpleKey,_void>.super_SmallVectorBase.Size
       = 0;
  this->IsSimpleKeyAllowed = false;
  pcVar1 = this->Current;
  consume(this,0x25);
  piVar5 = (int *)this->Current;
  piVar2 = (int *)this->End;
  piVar6 = piVar5;
  do {
    piVar4 = piVar6;
    if (((piVar2 != piVar6) && ((char)*piVar6 != '\t')) && ((char)*piVar6 != ' ')) {
      piVar4 = (int *)skip_nb_char(this,(iterator)piVar6);
    }
    bVar9 = piVar4 != piVar6;
    piVar6 = piVar4;
  } while (bVar9);
  this->Current = (iterator)piVar4;
  do {
    Position = piVar6;
    if ((piVar2 != piVar6) && (((char)*piVar6 == ' ' || ((char)*piVar6 == '\t')))) {
      Position = (int *)((long)piVar6 + 1);
    }
    bVar9 = Position != piVar6;
    piVar6 = Position;
  } while (bVar9);
  this->Current = (iterator)Position;
  local_40[0] = 0;
  if ((long)piVar4 - (long)piVar5 == 3) {
    if (*(char *)((long)piVar5 + 2) == 'G' && (short)*piVar5 == 0x4154) {
      do {
        piVar5 = Position;
        if (((piVar2 != Position) && ((char)*Position != '\t')) && ((char)*Position != ' ')) {
          piVar5 = (int *)skip_nb_char(this,(iterator)Position);
        }
        bVar9 = piVar5 != Position;
        Position = piVar5;
      } while (bVar9);
      this->Current = (iterator)piVar5;
      do {
        piVar6 = piVar5;
        if ((piVar2 != piVar5) && (((char)*piVar5 == ' ' || ((char)*piVar5 == '\t')))) {
          piVar6 = (int *)((long)piVar5 + 1);
        }
        bVar9 = piVar6 != piVar5;
        piVar5 = piVar6;
      } while (bVar9);
      this->Current = (iterator)piVar6;
      do {
        piVar5 = piVar6;
        if (((piVar2 != piVar6) && ((char)*piVar6 != '\t')) && ((char)*piVar6 != ' ')) {
          piVar5 = (int *)skip_nb_char(this,(iterator)piVar6);
        }
        bVar9 = piVar5 != piVar6;
        piVar6 = piVar5;
      } while (bVar9);
      uVar8 = 4;
      goto LAB_0018a9ae;
    }
  }
  else if (((long)piVar4 - (long)piVar5 == 4) && (*piVar5 == 0x4c4d4159)) {
    do {
      piVar5 = Position;
      if ((piVar2 != Position) && (((char)*Position != '\t' && ((char)*Position != ' ')))) {
        piVar5 = (int *)skip_nb_char(this,(iterator)Position);
      }
      bVar9 = piVar5 != Position;
      Position = piVar5;
    } while (bVar9);
    uVar8 = 3;
LAB_0018a9ae:
    this->Current = (iterator)piVar5;
    piVar7 = (ilist_node_base<false> *)
             BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>::Allocate
                       (&(this->TokenQueue).
                         super_BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>,0x48,0x10
                       );
    piVar7->Prev = (ilist_node_base<false> *)0x0;
    piVar7->Next = (ilist_node_base<false> *)0x0;
    uStack_60 = SUB84(pcVar1,0);
    uStack_5c = (undefined4)((ulong)pcVar1 >> 0x20);
    *(undefined4 *)&piVar7[1].Prev = uVar8;
    *(undefined4 *)((long)&piVar7[1].Prev + 4) = uStack_64;
    *(undefined4 *)&piVar7[1].Next = uStack_60;
    *(undefined4 *)((long)&piVar7[1].Next + 4) = uStack_5c;
    piVar7[2].Prev = (ilist_node_base<false> *)((long)piVar5 - (long)pcVar1);
    piVar7[2].Next = (ilist_node_base<false> *)&piVar7[3].Next;
    std::__cxx11::string::_M_construct<char*>((string *)&piVar7[2].Next,local_40,local_40);
    piVar3 = (this->TokenQueue).List.Sentinel.
             super_ilist_node_impl<llvm::ilist_detail::node_options<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::Node,_false,_false,_void>_>
             .super_node_base_type.Prev;
    piVar7->Next = (ilist_node_base<false> *)&(this->TokenQueue).List;
    piVar7->Prev = piVar3;
    piVar3->Next = piVar7;
    (this->TokenQueue).List.Sentinel.
    super_ilist_node_impl<llvm::ilist_detail::node_options<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::Node,_false,_false,_void>_>
    .super_node_base_type.Prev = piVar7;
    return true;
  }
  return false;
}

Assistant:

bool Scanner::scanDirective() {
  // Reset the indentation level.
  unrollIndent(-1);
  SimpleKeys.clear();
  IsSimpleKeyAllowed = false;

  StringRef::iterator Start = Current;
  consume('%');
  StringRef::iterator NameStart = Current;
  Current = skip_while(&Scanner::skip_ns_char, Current);
  StringRef Name(NameStart, Current - NameStart);
  Current = skip_while(&Scanner::skip_s_white, Current);

  Token T;
  if (Name == "YAML") {
    Current = skip_while(&Scanner::skip_ns_char, Current);
    T.Kind = Token::TK_VersionDirective;
    T.Range = StringRef(Start, Current - Start);
    TokenQueue.push_back(T);
    return true;
  } else if(Name == "TAG") {
    Current = skip_while(&Scanner::skip_ns_char, Current);
    Current = skip_while(&Scanner::skip_s_white, Current);
    Current = skip_while(&Scanner::skip_ns_char, Current);
    T.Kind = Token::TK_TagDirective;
    T.Range = StringRef(Start, Current - Start);
    TokenQueue.push_back(T);
    return true;
  }
  return false;
}